

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

quaternion dja::operator*(quaternion *a,quaternion *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  quaternion qVar9;
  
  fVar1 = a->re;
  fVar2 = (a->im).x;
  fVar3 = b->re;
  fVar4 = (b->im).x;
  fVar5 = (a->im).y;
  fVar6 = (b->im).y;
  fVar7 = (a->im).z;
  fVar8 = (b->im).z;
  qVar9.im.y = (fVar7 * fVar4 - fVar8 * fVar2) + fVar3 * fVar5 + fVar1 * fVar6;
  qVar9.im.x = (fVar5 * fVar8 - fVar6 * fVar7) + fVar3 * fVar2 + fVar1 * fVar4;
  qVar9.re = fVar1 * fVar3 - (fVar7 * fVar8 + fVar2 * fVar4 + fVar5 * fVar6);
  qVar9.im.z = (fVar2 * fVar6 - fVar4 * fVar5) + fVar3 * fVar7 + fVar1 * fVar8;
  return qVar9;
}

Assistant:

Q OP*(const Q& a, const Q& b) {
    V1 re = a.re * b.re - dot(a.im, b.im);
    V3 im = a.re * b.im + a.im * b.re + cross(a.im, b.im);
    return Q(re, im);
}